

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vbo.cpp
# Opt level: O0

void __thiscall vera::Vbo::~Vbo(Vbo *this)

{
  Vbo *this_local;
  
  this->_vptr_Vbo = (_func_int **)&PTR__Vbo_0076c138;
  std::vector<signed_char,_std::allocator<signed_char>_>::clear(&this->m_vertexData);
  std::vector<unsigned_int,_std::allocator<unsigned_int>_>::clear(&this->m_indices);
  if ((this->m_vertexLayout != (VertexLayout *)0x0) && (this->m_vertexLayout != (VertexLayout *)0x0)
     ) {
    (*this->m_vertexLayout->_vptr_VertexLayout[1])();
  }
  glDeleteBuffers(1,&this->m_glVertexBuffer);
  glDeleteBuffers(1,&this->m_glIndexBuffer);
  std::vector<unsigned_int,_std::allocator<unsigned_int>_>::~vector(&this->m_indices);
  std::vector<signed_char,_std::allocator<signed_char>_>::~vector(&this->m_vertexData);
  return;
}

Assistant:

Vbo::~Vbo() {
    m_vertexData.clear();
    m_indices.clear();

    if (m_vertexLayout != NULL)
        delete m_vertexLayout;

    glDeleteBuffers(1, &m_glVertexBuffer);
    glDeleteBuffers(1, &m_glIndexBuffer);
}